

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O2

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint _w;
  uint _h;
  size_t _elemsize;
  int *piVar2;
  void *pvVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int i;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int k;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int j;
  int iVar18;
  ulong uVar19;
  int i_2;
  uint uVar20;
  ulong uVar21;
  float fVar22;
  Mat square_sum;
  Mat square_blob;
  Option opt_b;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  _w = bottom_top_blob->w;
  _h = bottom_top_blob->h;
  iVar18 = bottom_top_blob->c;
  _elemsize = bottom_top_blob->elemsize;
  square_blob.cstep = 0;
  square_blob.data = (void *)0x0;
  square_blob.refcount._0_4_ = 0;
  square_blob.refcount._4_4_ = 0;
  square_blob.elemsize._0_4_ = 0;
  square_blob.elemsize._4_4_ = 0;
  square_blob.elempack = 0;
  square_blob.allocator = (Allocator *)0x0;
  square_blob.dims = 0;
  square_blob.w = 0;
  square_blob.h = 0;
  square_blob.d = 0;
  square_blob.c = 0;
  Mat::create(&square_blob,_w,_h,iVar18,_elemsize,opt->workspace_allocator);
  iVar13 = -100;
  if ((square_blob.data == (void *)0x0) || ((long)square_blob.c * square_blob.cstep == 0))
  goto LAB_001d12ad;
  uVar8 = 0;
  uVar21 = (ulong)(_h * _w);
  if ((int)(_h * _w) < 1) {
    uVar21 = uVar8;
  }
  iVar7 = 0;
  if (0 < iVar18) {
    iVar7 = iVar18;
  }
  while (iVar13 = (int)uVar8, iVar13 != iVar7) {
    Mat::channel(&square_sum,bottom_top_blob,iVar13);
    pvVar3 = square_sum.data;
    Mat::~Mat(&square_sum);
    Mat::channel(&square_sum,&square_blob,iVar13);
    pvVar4 = square_sum.data;
    Mat::~Mat(&square_sum);
    for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
      fVar1 = *(float *)((long)pvVar3 + uVar8 * 4);
      *(float *)((long)pvVar4 + uVar8 * 4) = fVar1 * fVar1;
    }
    uVar8 = (ulong)(iVar13 + 1);
  }
  if (this->region_type == 0) {
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.allocator = (Allocator *)0x0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
    Mat::create(&square_sum,_w,_h,iVar18,_elemsize,opt->workspace_allocator);
    if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0)) {
LAB_001d12a0:
      Mat::~Mat(&square_sum);
      iVar13 = -100;
      goto LAB_001d12ad;
    }
    Mat::fill(&square_sum,0.0);
    fVar1 = this->alpha;
    iVar13 = this->local_size;
    for (iVar15 = 0; iVar15 != iVar7; iVar15 = iVar15 + 1) {
      Mat::channel((Mat *)&opt_b,&square_sum,iVar15);
      uVar5 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      iVar16 = this->local_size;
      for (iVar14 = iVar16 / -2 + iVar15; iVar14 <= iVar16 / 2 + iVar15; iVar14 = iVar14 + 1) {
        if (iVar14 < iVar18 && -1 < iVar14) {
          Mat::channel((Mat *)&opt_b,&square_blob,iVar14);
          uVar6 = opt_b._0_8_;
          Mat::~Mat((Mat *)&opt_b);
          for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)(uVar5 + uVar8 * 4) =
                 *(float *)(uVar5 + uVar8 * 4) + *(float *)(uVar6 + uVar8 * 4);
          }
          iVar16 = this->local_size;
        }
      }
      Mat::channel((Mat *)&opt_b,bottom_top_blob,iVar15);
      uVar6 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
        fVar22 = powf(*(float *)(uVar5 + uVar8 * 4) * fVar1 * (1.0 / (float)iVar13) + this->bias,
                      -this->beta);
        *(float *)(uVar6 + uVar8 * 4) = fVar22 * *(float *)(uVar6 + uVar8 * 4);
      }
    }
  }
  else {
    iVar13 = 0;
    if (this->region_type != 1) goto LAB_001d12ad;
    piVar2 = (int *)CONCAT44(square_blob.refcount._4_4_,square_blob.refcount._0_4_);
    square_sum.data = square_blob.data;
    square_sum.refcount._0_4_ = square_blob.refcount._0_4_;
    square_sum.refcount._4_4_ = square_blob.refcount._4_4_;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = square_blob.elemsize._4_4_;
    square_sum.elempack = square_blob.elempack;
    square_sum.allocator = square_blob.allocator;
    square_sum.dims = square_blob.dims;
    square_sum.w = square_blob.w;
    square_sum.h = square_blob.h;
    square_sum.d = square_blob.d;
    square_sum.c = square_blob.c;
    square_sum.cstep = square_blob.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    uVar20 = this->local_size;
    uVar12 = _w;
    if (1 < (int)uVar20) {
      uVar12 = uVar20 >> 1;
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.openmp_blocktime = opt->openmp_blocktime;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      uVar21._0_1_ = opt->use_bf16_storage;
      uVar21._1_1_ = opt->use_fp16_packed;
      uVar21._2_1_ = opt->use_fp16_storage;
      uVar21._3_1_ = opt->use_fp16_arithmetic;
      uVar21._4_1_ = opt->use_int8_packed;
      uVar21._5_1_ = opt->use_int8_storage;
      uVar21._6_1_ = opt->use_int8_arithmetic;
      uVar21._7_1_ = opt->use_packing_layout;
      opt_b.use_shader_pack8 = opt->use_shader_pack8;
      opt_b.use_subgroup_basic = opt->use_subgroup_basic;
      opt_b.use_subgroup_vote = opt->use_subgroup_vote;
      opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_b.use_image_storage = opt->use_image_storage;
      opt_b.use_tensor_storage = opt->use_tensor_storage;
      opt_b.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      opt_b.flush_denormals = opt->flush_denormals;
      opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_b.use_reserved_1 = opt->use_reserved_1;
      opt_b.use_reserved_2 = opt->use_reserved_2;
      opt_b.use_reserved_3 = opt->use_reserved_3;
      opt_b.use_reserved_4 = opt->use_reserved_4;
      opt_b.use_reserved_5 = opt->use_reserved_5;
      opt_b.use_reserved_6 = opt->use_reserved_6;
      opt_b.use_reserved_7 = opt->use_reserved_7;
      opt_b.use_reserved_8 = opt->use_reserved_8;
      opt_b.use_reserved_9 = opt->use_reserved_9;
      opt_b.use_reserved_10 = opt->use_reserved_10;
      opt_b.use_reserved_11 = opt->use_reserved_11;
      opt_b.blob_allocator = opt->workspace_allocator;
      opt_b._32_8_ = uVar21 & 0xffffffffffffff;
      copy_make_border(&square_blob,&square_sum,uVar12,~uVar12 + uVar20,uVar12,~uVar12 + uVar20,0,
                       0.0,&opt_b);
      if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0))
      goto LAB_001d12a0;
      uVar20 = this->local_size;
      uVar12 = square_sum.w;
    }
    uVar20 = uVar20 * uVar20;
    fVar1 = this->alpha;
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(ulong)uVar20,(allocator_type *)&opt_b);
    iVar18 = this->local_size;
    iVar15 = uVar12 - iVar18;
    lVar9 = 0;
    iVar13 = 0;
    for (iVar16 = 0; iVar16 < iVar18; iVar16 = iVar16 + 1) {
      for (lVar17 = 0; iVar14 = (int)lVar17, iVar14 < iVar18; lVar17 = lVar17 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar9 + lVar17] = iVar13 + iVar14;
        iVar18 = this->local_size;
      }
      iVar13 = iVar13 + iVar15 + iVar14;
      lVar9 = (int)lVar9 + lVar17;
    }
    uVar8 = 0;
    uVar21 = (ulong)_w;
    if ((int)_w < 1) {
      uVar21 = uVar8;
    }
    uVar10 = (ulong)_h;
    if ((int)_h < 1) {
      uVar10 = uVar8;
    }
    while( true ) {
      iVar18 = (int)uVar8;
      if (iVar18 == iVar7) break;
      Mat::channel((Mat *)&opt_b,bottom_top_blob,iVar18);
      lVar9 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      Mat::channel((Mat *)&opt_b,&square_sum,iVar18);
      for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
        lVar17 = (long)(int)opt_b._44_4_ * uVar8 * (long)opt_b.workspace_allocator + opt_b._0_8_;
        for (uVar19 = 0; uVar19 != uVar21; uVar19 = uVar19 + 1) {
          fVar22 = 0.0;
          for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
            fVar22 = fVar22 + *(float *)(uVar19 * 4 + lVar17 +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar11] * 4);
          }
          fVar22 = powf(fVar22 * fVar1 * (1.0 / (float)(int)uVar20) + this->bias,-this->beta);
          *(float *)(lVar9 + uVar19 * 4) = fVar22 * *(float *)(lVar9 + uVar19 * 4);
        }
        lVar9 = lVar9 + (long)(int)_w * 4;
      }
      Mat::~Mat((Mat *)&opt_b);
      uVar8 = (ulong)(iVar18 + 1);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&square_sum);
  iVar13 = 0;
LAB_001d12ad:
  Mat::~Mat(&square_blob);
  return iVar13;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i = 0; i < size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                ptr[i] = static_cast<float>(ptr[i] * pow(bias + alpha_div_size * ssptr[i], -beta));
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            opt_b.use_packing_layout = false;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = static_cast<float>(ptr[j] * pow(bias + alpha_div_size * ss, -beta));
                }

                ptr += outw;
            }
        }
    }

    return 0;
}